

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O3

string * base64_encode_abi_cxx11_
                   (string *__return_storage_ptr__,uchar *bytes_to_encode,size_t in_len)

{
  char cVar1;
  ulong uVar2;
  long lVar3;
  uchar char_array_3 [3];
  uchar char_array_4 [4];
  byte local_2f [4];
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (in_len != 0) {
    uVar2 = 0;
    do {
      local_2f[uVar2] = *bytes_to_encode;
      uVar2 = uVar2 + 1;
      cVar1 = (char)__return_storage_ptr__;
      if (uVar2 == 3) {
        local_2f[3] = local_2f[0] >> 2;
        local_2b = (local_2f[0] & 3) << 4 | local_2f[1] >> 4;
        local_2a = (local_2f[1] & 0xf) << 2 | local_2f[2] >> 6;
        local_29 = local_2f[2] & 0x3f;
        lVar3 = 0;
        do {
          std::__cxx11::string::push_back(cVar1);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 4);
        uVar2 = 0;
      }
      in_len = in_len - 1;
      bytes_to_encode = bytes_to_encode + 1;
    } while (in_len != 0);
    if (uVar2 != 0) {
      if (uVar2 < 3) {
        memset(local_2f + uVar2,0,3 - uVar2);
      }
      local_2f[3] = local_2f[0] >> 2;
      local_2b = (local_2f[0] & 3) << 4 | local_2f[1] >> 4;
      local_2a = (local_2f[1] & 0xf) << 2 | local_2f[2] >> 6;
      lVar3 = 0;
      do {
        std::__cxx11::string::push_back(cVar1);
        lVar3 = lVar3 + 1;
      } while (uVar2 + 1 != lVar3);
      uVar2 = uVar2 - 1;
      while (uVar2 = uVar2 + 1, uVar2 < 3) {
        std::__cxx11::string::push_back(cVar1);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base64_encode(const unsigned char* bytes_to_encode, std::size_t in_len) {
		std::string ret;
		std::size_t i = 0;
		std::size_t j = 0;

		unsigned char char_array_3[3];
		unsigned char char_array_4[4];

		while (in_len--) {
			char_array_3[i++] = *(bytes_to_encode++);
			if (i == 3) {
				char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
				char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
				char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
				char_array_4[3] = char_array_3[2] & 0x3f;

				for (i = 0; (i < 4); i++)
					ret += base64_chars[char_array_4[i]];
				i = 0;
			}
		}

		if (i)
		{
			for (j = i; j < 3; j++)
				char_array_3[j] = '\0';

			char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
			char_array_4[1] = ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
			char_array_4[2] = ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);

			for (j = 0; (j < i + 1); j++)
				ret += base64_chars[char_array_4[j]];

			while ((i++ < 3))
				ret += '=';

		}
		return ret;
	}